

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrLDA0xa9(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = immediate_addr((CPU *)0x111718);
  LDA(in_RDI,argument);
  return 2;
}

Assistant:

int CPU::instrLDA0xa9() {
	LDA(immediate_addr());
	return 2;
}